

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall bandit::context::bandit::~bandit(bandit *this)

{
  (this->super_interface)._vptr_interface = (_func_int **)&PTR__bandit_0011bc48;
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->after_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
  _M_clear(&(this->before_eaches_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
  std::__cxx11::string::~string((string *)&this->desc_);
  return;
}

Assistant:

bandit(const std::string& desc, bool hard_skip_a)
          : desc_(desc), hard_skip_(hard_skip_a), is_executing_(false) {}